

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O1

void __thiscall SpiAnalyzer::GetWord(SpiAnalyzer *this)

{
  U32 UVar1;
  SpiAnalyzerSettings *pSVar2;
  pointer puVar3;
  iterator iVar4;
  SpiAnalyzerResults *pSVar5;
  bool bVar6;
  bool bVar7;
  U64 UVar8;
  ulong uVar9;
  uint uVar10;
  BitState BVar11;
  int iVar13;
  int iVar14;
  ulong uVar15;
  FrameV2 framev2;
  FrameV2 frame_v2_end_of_transaction;
  U64 disable_event_sample;
  U64 miso_word;
  U64 mosi_word;
  U8 miso_bytearray [8];
  U8 mosi_bytearray [8];
  Frame result_frame;
  ulonglong local_a8;
  FrameV2 local_a0 [8];
  FrameV2 local_98 [8];
  U64 *local_90;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *local_88;
  U64 local_80;
  ulong local_78;
  ulong local_70;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  ulonglong local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  undefined1 local_37;
  BitState BVar12;
  
  pSVar2 = (this->mSettings)._M_ptr;
  UVar1 = pSVar2->mBitsPerTransfer;
  local_70 = 0;
  DataBuilder::Reset((ulonglong *)&this->mMosiResult,(ShiftOrder)&local_70,pSVar2->mShiftOrder);
  local_78 = 0;
  DataBuilder::Reset((ulonglong *)&this->mMisoResult,(ShiftOrder)&local_78,
                     ((this->mSettings)._M_ptr)->mShiftOrder);
  local_80 = 0;
  puVar3 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->mArrowLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  AnalyzerChannelData::GetSampleNumber();
  Analyzer::ReportProgress((ulonglong)this);
  bVar6 = true;
  bVar7 = false;
  if (UVar1 == 0) {
    local_a8 = 0;
  }
  else {
    local_88 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
               &this->mArrowLocations;
    local_90 = &this->mCurrentSample;
    local_a8 = 0;
    iVar13 = 0;
    do {
      if (iVar13 == 0) {
        Analyzer::CheckIfThreadShouldExit();
      }
      bVar6 = WouldAdvancingTheClockToggleEnable(this,true,(U64 *)0x0);
      if (bVar6) {
LAB_001062e0:
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
        bVar6 = false;
        bVar7 = false;
        goto LAB_001062f1;
      }
      AnalyzerChannelData::AdvanceToNextEdge();
      iVar14 = iVar13 + -1;
      if (iVar13 == 0) {
        local_a8 = AnalyzerChannelData::GetSampleNumber();
      }
      BVar11 = (BitState)&this->mMosiResult;
      BVar12 = (BitState)&this->mMisoResult;
      if (((this->mSettings)._M_ptr)->mDataValidEdge == LeadingEdge) {
        UVar8 = AnalyzerChannelData::GetSampleNumber();
        this->mCurrentSample = UVar8;
        if (this->mMosi != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit(BVar11);
        }
        if (this->mMiso != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit(BVar12);
        }
        iVar4._M_current =
             (this->mArrowLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->mArrowLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>(local_88,iVar4,local_90);
        }
        else {
          *iVar4._M_current = this->mCurrentSample;
          (this->mArrowLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      if ((iVar13 + UVar1 == 1) && (((this->mSettings)._M_ptr)->mDataValidEdge != TrailingEdge)) {
        bVar7 = WouldAdvancingTheClockToggleEnable(this,false,&local_80);
        bVar6 = true;
        if (bVar7) {
          bVar7 = true;
        }
        else {
          AnalyzerChannelData::AdvanceToNextEdge();
          bVar6 = true;
          bVar7 = false;
        }
        goto LAB_001062f1;
      }
      bVar6 = WouldAdvancingTheClockToggleEnable(this,true,(U64 *)0x0);
      if (bVar6) goto LAB_001062e0;
      AnalyzerChannelData::AdvanceToNextEdge();
      if (((this->mSettings)._M_ptr)->mDataValidEdge == TrailingEdge) {
        UVar8 = AnalyzerChannelData::GetSampleNumber();
        this->mCurrentSample = UVar8;
        if (this->mMosi != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit(BVar11);
        }
        if (this->mMiso != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit(BVar12);
        }
        iVar4._M_current =
             (this->mArrowLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->mArrowLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>(local_88,iVar4,local_90);
        }
        else {
          *iVar4._M_current = this->mCurrentSample;
          (this->mArrowLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      iVar13 = iVar14;
    } while (UVar1 + iVar14 != 0);
    bVar7 = false;
    bVar6 = true;
  }
LAB_001062f1:
  if (bVar6) {
    uVar9 = (ulong)((long)(this->mArrowLocations).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mArrowLocations).
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    if ((int)uVar9 != 0) {
      uVar15 = 0;
      do {
        AnalyzerResults::AddMarker
                  ((ulonglong)(this->mResults)._M_ptr,
                   (MarkerType)
                   (this->mArrowLocations).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar15],
                   (Channel *)(ulong)this->mArrowMarker);
        uVar15 = uVar15 + 1;
      } while ((uVar9 & 0xffffffff) != uVar15);
    }
    Frame::Frame((Frame *)&local_58);
    local_58 = local_a8;
    local_50 = AnalyzerChannelData::GetSampleNumber();
    local_48 = local_70;
    local_40 = local_78;
    local_37 = 0;
    AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    FrameV2::FrameV2(local_a0);
    uVar10 = UVar1 + 7 >> 3;
    if (7 < UVar1 + 7) {
      iVar13 = uVar10 * 8;
      uVar9 = 0;
      do {
        iVar13 = iVar13 + -8;
        local_60[uVar9] = (char)(local_70 >> ((byte)iVar13 & 0x3f));
        local_68[uVar9] = (char)(local_78 >> ((byte)iVar13 & 0x3f));
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    FrameV2::AddByteArray((char *)local_a0,(uchar *)"mosi",(ulonglong)local_60);
    FrameV2::AddByteArray((char *)local_a0,(uchar *)"miso",(ulonglong)local_68);
    pSVar5 = (this->mResults)._M_ptr;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pSVar5,(char *)local_a0,0x109017,local_a8);
    AnalyzerResults::CommitResults();
    if (bVar7) {
      FrameV2::FrameV2(local_98);
      AnalyzerResults::AddFrameV2
                ((FrameV2 *)(this->mResults)._M_ptr,(char *)local_98,0x10901e,local_80);
      AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
      FrameV2::~FrameV2(local_98);
    }
    FrameV2::~FrameV2(local_a0);
    Frame::~Frame((Frame *)&local_58);
  }
  return;
}

Assistant:

void SpiAnalyzer::GetWord()
{
    // we're assuming we come into this function with the clock in the idle state;

    const U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    const U32 bytes_per_transfer = ( bits_per_transfer + 7 ) / 8;

    U64 mosi_word = 0;
    mMosiResult.Reset( &mosi_word, mSettings->mShiftOrder, bits_per_transfer );

    U64 miso_word = 0;
    mMisoResult.Reset( &miso_word, mSettings->mShiftOrder, bits_per_transfer );

    U64 first_sample = 0;
    bool need_reset = false;
    U64 disable_event_sample = 0;


    mArrowLocations.clear();
    ReportProgress( mClock->GetSampleNumber() );

    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        if( i == 0 )
            CheckIfThreadShouldExit();

        // on every single edge, we need to check that enable doesn't toggle.
        // note that we can't just advance the enable line to the next edge, becuase there may not be another edge

        if( WouldAdvancingTheClockToggleEnable( true, nullptr ) == true )
        {
            AdvanceToActiveEnableEdgeWithCorrectClockPolarity(); // ok, we pretty much need to reset everything and return.
            return;
        }

        mClock->AdvanceToNextEdge();
        if( i == 0 )
            first_sample = mClock->GetSampleNumber();

        if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
        {
            mCurrentSample = mClock->GetSampleNumber();
            if( mMosi != NULL )
            {
                mMosi->AdvanceToAbsPosition( mCurrentSample );
                mMosiResult.AddBit( mMosi->GetBitState() );
            }
            if( mMiso != NULL )
            {
                mMiso->AdvanceToAbsPosition( mCurrentSample );
                mMisoResult.AddBit( mMiso->GetBitState() );
            }
            mArrowLocations.push_back( mCurrentSample );
        }


        // ok, the trailing edge is messy -- but only on the very last bit.
        // If the trialing edge isn't doesn't represent valid data, we want to allow the enable line to rise before the clock trialing edge
        // -- and still report the frame
        if( ( i == ( bits_per_transfer - 1 ) ) && ( mSettings->mDataValidEdge != AnalyzerEnums::TrailingEdge ) )
        {
            // if this is the last bit, and the trailing edge doesn't represent valid data
            if( WouldAdvancingTheClockToggleEnable( false, &disable_event_sample ) == true )
            {
                // moving to the trailing edge would cause the clock to revert to inactive.  jump out, record the frame, and them move to
                // the next active enable edge
                need_reset = true;
                break;
            }

            // enable isn't going to go inactive, go ahead and advance the clock as usual.  Then we're done, jump out and record the frame.
            mClock->AdvanceToNextEdge();
            break;
        }

        // this isn't the very last bit, etc, so proceed as normal
        if( WouldAdvancingTheClockToggleEnable( true, nullptr ) == true )
        {
            AdvanceToActiveEnableEdgeWithCorrectClockPolarity(); // ok, we pretty much need to reset everything and return.
            return;
        }

        mClock->AdvanceToNextEdge();

        if( mSettings->mDataValidEdge == AnalyzerEnums::TrailingEdge )
        {
            mCurrentSample = mClock->GetSampleNumber();
            if( mMosi != NULL )
            {
                mMosi->AdvanceToAbsPosition( mCurrentSample );
                mMosiResult.AddBit( mMosi->GetBitState() );
            }
            if( mMiso != NULL )
            {
                mMiso->AdvanceToAbsPosition( mCurrentSample );
                mMisoResult.AddBit( mMiso->GetBitState() );
            }
            mArrowLocations.push_back( mCurrentSample );
        }
    }

    // save the results:
    U32 count = mArrowLocations.size();
    for( U32 i = 0; i < count; i++ )
        mResults->AddMarker( mArrowLocations[ i ], mArrowMarker, mSettings->mClockChannel );

    Frame result_frame;
    result_frame.mStartingSampleInclusive = first_sample;
    result_frame.mEndingSampleInclusive = mClock->GetSampleNumber();
    result_frame.mData1 = mosi_word;
    result_frame.mData2 = miso_word;
    result_frame.mFlags = 0;
    mResults->AddFrame( result_frame );

    FrameV2 framev2;

    // Max bits per transfer == 64, max bytes == 8
    U8 mosi_bytearray[ 8 ];
    U8 miso_bytearray[ 8 ];
    for( int i = 0; i < bytes_per_transfer; ++i )
    {
        auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
        mosi_bytearray[ i ] = mosi_word >> bit_offset;
        miso_bytearray[ i ] = miso_word >> bit_offset;
    }
    framev2.AddByteArray( "mosi", mosi_bytearray, bytes_per_transfer );
    framev2.AddByteArray( "miso", miso_bytearray, bytes_per_transfer );

    mResults->AddFrameV2( framev2, "result", first_sample, mClock->GetSampleNumber() + 1 );

    mResults->CommitResults();

    if( need_reset == true )
    {
        FrameV2 frame_v2_end_of_transaction;
        mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", disable_event_sample, disable_event_sample + 1 );
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity();
    }
}